

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<unsigned_int> * __thiscall
wasm::IRBuilder::addScratchLocal
          (Result<unsigned_int> *__return_storage_ptr__,IRBuilder *this,Type type)

{
  Function *func;
  Index IVar1;
  Type in_R8;
  Name NVar2;
  Name name;
  string_view local_68;
  string local_58 [39];
  allocator<char> local_31;
  
  func = this->func;
  if (func == (Function *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,"scratch local required, but there is no function context",&local_31);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string(local_58);
  }
  else {
    Name::Name((Name *)&local_68,"scratch");
    NVar2 = Names::getValidLocalName(func,(Name)local_68);
    name.super_IString.str._M_len = NVar2.super_IString.str._M_str;
    name.super_IString.str._M_str = (char *)type.id;
    IVar1 = Builder::addVar((Builder *)this->func,NVar2.super_IString.str._M_len,name,in_R8);
    *(Index *)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> = IVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> IRBuilder::addScratchLocal(Type type) {
  if (!func) {
    return Err{"scratch local required, but there is no function context"};
  }
  Name name = Names::getValidLocalName(*func, "scratch");
  return Builder::addVar(func, name, type);
}